

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_ListAddCubeTail_(Mvc_List_t *pList,Mvc_Cube_t *pCube)

{
  Mvc_Cube_t *pCube_local;
  Mvc_List_t *pList_local;
  
  if (pList->pHead == (Mvc_Cube_t *)0x0) {
    pList->pHead = pCube;
  }
  else {
    pList->pTail->pNext = pCube;
  }
  pList->pTail = pCube;
  pCube->pNext = (Mvc_Cube_t *)0x0;
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Mvc_ListAddCubeTail_( Mvc_List_t * pList, Mvc_Cube_t * pCube )
{
    if ( pList->pHead == NULL )
        pList->pHead = pCube;
    else
        Mvc_CubeSetNext( pList->pTail, pCube );
    pList->pTail    = pCube;
    Mvc_CubeSetNext( pCube, NULL );
    pList->nItems++;
}